

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  uint *puVar1;
  int key;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 *puVar5;
  uint32 uVar6;
  FieldDescriptor *field;
  long *plVar7;
  ulong uVar8;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  key = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_));
  if (key != 0) {
    field = Descriptor::FindFieldByNumber(this->descriptor_,key);
    uVar8 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar8 & 1) != 0) {
      uVar8 = *(ulong *)((uVar8 & 0xfffffffffffffffe) + 0x18);
    }
    if (uVar8 == 0) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_38 = FieldDescriptor::TypeOnceInit;
        local_40 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),&local_38,&local_40);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
        plVar7 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6);
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 8))();
        }
      }
      else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) ==
               9) {
        plVar7 = (long *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
        puVar3 = (undefined8 *)*plVar7;
        lVar4 = *(long *)(field + 0x58);
        if (lVar4 == 0) {
          uVar8 = (ulong)(uint)(this->schema_).has_bits_offset_;
          if (uVar8 != 0xffffffff) {
            if (field[0x42] == (FieldDescriptor)0x0) {
              plVar7 = (long *)(*(long *)(field + 0x50) + 0x28);
            }
            else if (*(long *)(field + 0x60) == 0) {
              plVar7 = (long *)(*(long *)(field + 0x28) + 0x80);
            }
            else {
              plVar7 = (long *)(*(long *)(field + 0x60) + 0x50);
            }
            uVar2 = (this->schema_).has_bit_indices_
                    [(int)((ulong)((long)field - *plVar7) >> 3) * 0x286bca1b];
            puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                             (ulong)(uVar2 >> 5) * 4 + uVar8);
            *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
          }
        }
        else {
          *(undefined4 *)
           ((long)&(message->super_MessageLite)._vptr_MessageLite +
           (ulong)(uint)((int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x30)) >> 4) *
                         -0x55555554 + (this->schema_).oneof_case_offset_)) =
               *(undefined4 *)(field + 0x44);
        }
        uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
        uVar8 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                          (ulong)(uint)(this->schema_).metadata_offset_);
        if ((uVar8 & 1) != 0) {
          uVar8 = *(ulong *)((uVar8 & 0xfffffffffffffffe) + 0x18);
        }
        if ((uVar8 == 0) &&
           (puVar5 = *(undefined8 **)
                      ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
           puVar5 != puVar3)) {
          if ((puVar5 != (undefined8 *)0x0) && ((undefined8 *)*puVar5 != puVar5 + 2)) {
            operator_delete((undefined8 *)*puVar5);
          }
          operator_delete(puVar5);
        }
      }
    }
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) = 0;
  }
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  // TODO(jieluo): Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32 oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (GetArena(message) == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableField<ArenaStringPtr>(message, field)
                  ->Destroy(default_ptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}